

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void __thiscall Omega_h::HostRead<long>::HostRead(HostRead<long> *this,Read<signed_char> *read)

{
  ScopedTimer timer;
  ScopedTimer local_11;
  
  Write<long>::Write((Write<int> *)this,(Write<int> *)read);
  begin_code("array device to host",(char *)0x0);
  ScopedTimer::~ScopedTimer(&local_11);
  return;
}

Assistant:

HostRead<T>::HostRead(Read<T> read) : read_(read) {
  ScopedTimer timer("array device to host");
#ifdef OMEGA_H_USE_KOKKOS
  Kokkos::View<const T*> dev_view = read.view();
  Kokkos::View<const T*, Kokkos::HostSpace> h_view =
      Kokkos::create_mirror_view_and_copy(Kokkos::HostSpace(), read.view());
  mirror_ = h_view;
#elif defined(OMEGA_H_USE_CUDA)
  mirror_.reset(new T[std::size_t(read_.size())]);
  auto const err = cudaMemcpy(mirror_.get(), read_.data(),
      std::size_t(size()) * sizeof(T), cudaMemcpyDeviceToHost);
  OMEGA_H_CHECK(err == cudaSuccess);
#endif
}